

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogCompare.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  deInt32 *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_color _Var3;
  TestStatusCode TVar4;
  char *pcVar5;
  LogFileReader **ppLVar6;
  pointer pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  bool bVar9;
  Entry *pEVar10;
  LogFileReader *this;
  iterator iVar11;
  pointer pOVar12;
  const_iterator cVar13;
  ostream *poVar14;
  size_t sVar15;
  Error *pEVar16;
  undefined1 auVar17 [8];
  int iVar18;
  long lVar19;
  pointer pSVar20;
  long lVar21;
  pointer pOVar22;
  long lVar23;
  char *pcVar24;
  int iVar25;
  key_type *__k;
  pointer pbVar26;
  vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> readers;
  Parser parser;
  CommandLine cmdLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  caseList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  batchNames;
  allocator<char> local_179;
  vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_> local_178;
  Parser local_158;
  ulong local_140;
  undefined8 local_138;
  int local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  _Base_ptr local_78;
  ShortBatchResult *local_70;
  undefined1 *local_68;
  pointer_____offset_0x10___ *local_60;
  undefined1 local_58 [16];
  SetDefaultFunc local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_138 = 0x100000000;
  local_130 = 0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  de::cmdline::detail::Parser::Parser(&local_158);
  de::cmdline::detail::TypedFieldMap::TypedFieldMap((TypedFieldMap *)local_108);
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 1) {
    pEVar16 = (Error *)__cxa_allocate_exception(0x10);
    xe::Error::Error(pEVar16,(char *)0x0,"argc >= 1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                     ,0x174);
    __cxa_throw(pEVar16,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_48 = (SetDefaultFunc)0x0;
  local_98._0_8_ = "f";
  local_98._8_8_ = "format";
  local_88._0_8_ = "Output format";
  local_88._8_8_ = "csv";
  local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
  local_70 = (ShortBatchResult *)0x0;
  local_68 = opt::registerOptions(de::cmdline::detail::Parser&)::s_outputFormats;
  local_60 = (pointer_____offset_0x10___ *)
             opt::registerOptions(de::cmdline::detail::Parser&)::s_outputValues;
  local_58._0_8_ = 0x10;
  local_58._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutFormat>;
  de::cmdline::detail::Parser::addOption(&local_158,(OptInfo *)local_98);
  local_48 = (SetDefaultFunc)0x0;
  local_98._0_8_ = "m";
  local_98._8_8_ = "mode";
  local_88._0_8_ = "Output mode";
  local_88._8_8_ = "all";
  local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
  local_70 = (ShortBatchResult *)0x0;
  local_68 = opt::registerOptions(de::cmdline::detail::Parser&)::s_outputModes;
  local_60 = (pointer_____offset_0x10___ *)
             opt::registerOptions(de::cmdline::detail::Parser&)::s_outputFormats;
  local_58._0_8_ = 0x10;
  local_58._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutMode>;
  de::cmdline::detail::Parser::addOption(&local_158,(OptInfo *)local_98);
  local_48 = (SetDefaultFunc)0x0;
  local_98._0_8_ = "v";
  local_98._8_8_ = "value";
  local_88._0_8_ = "Value to extract";
  local_88._8_8_ = (long)"status code" + 7;
  local_78 = (_Base_ptr)((ulong)local_78 & 0xffffffffffffff00);
  local_70 = (ShortBatchResult *)0x0;
  local_68 = opt::registerOptions(de::cmdline::detail::Parser&)::s_outputValues;
  local_60 = &opt::OutValue::typeinfo;
  local_58._0_8_ = 0x10;
  local_58._8_8_ = de::cmdline::detail::Parser::dispatchParse<opt::OutValue>;
  de::cmdline::detail::Parser::addOption(&local_158,(OptInfo *)local_98);
  bVar9 = de::cmdline::detail::Parser::parse
                    (&local_158,argc + -1,argv + 1,(CommandLine *)local_108,(ostream *)&std::cerr);
  if ((bVar9) &&
     (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pEVar10 = de::cmdline::detail::TypedFieldMap::get
                        ((TypedFieldMap *)local_108,(type_info *)&opt::OutFormat::typeinfo);
    local_138._4_4_ = *pEVar10->value;
    pEVar10 = de::cmdline::detail::TypedFieldMap::get
                        ((TypedFieldMap *)local_108,(type_info *)&opt::OutMode::typeinfo);
    local_138 = CONCAT44(local_138._4_4_,*pEVar10->value);
    pEVar10 = de::cmdline::detail::TypedFieldMap::get
                        ((TypedFieldMap *)local_108,(type_info *)&opt::OutValue::typeinfo);
    local_130 = *pEVar10->value;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&local_128,&local_d8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    de::cmdline::detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_108);
    de::cmdline::detail::Parser::~Parser(&local_158);
    local_158.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_158.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.m_options.
    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_128.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pEVar16 = (Error *)__cxa_allocate_exception(0x10);
      xe::Error::Error(pEVar16,(char *)0x0,"!cmdLine.filenames.empty()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/tools/xeTestLogCompare.cpp"
                       ,0x10e);
      __cxa_throw(pEVar16,&xe::Error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::resize
              ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)&local_158,
               (long)local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_128.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    local_178.
    super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (0 < (int)((ulong)((long)local_128.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_128.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5)) {
      lVar21 = 0;
      lVar19 = 0;
      lVar23 = 0;
      do {
        pbVar26 = local_128.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this = (LogFileReader *)operator_new(0x40);
        LogFileReader::LogFileReader
                  (this,(ShortBatchResult *)
                        ((long)&(local_158.m_options.
                                 super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->shortName + lVar21),
                   *(char **)((long)&(pbVar26->_M_dataplus)._M_p + lVar19));
        local_98._8_8_ = (SharedPtrStateBase *)0x0;
        local_98._0_8_ = this;
        local_98._8_8_ = operator_new(0x20);
        ((SharedPtrStateBase *)local_98._8_8_)->strongRefCount = 0;
        ((SharedPtrStateBase *)local_98._8_8_)->weakRefCount = 0;
        ((SharedPtrStateBase *)local_98._8_8_)->_vptr_SharedPtrStateBase =
             (_func_int **)&PTR__SharedPtrState_0012df88;
        ((SharedPtrStateBase *)(local_98._8_8_ + 0x10))->_vptr_SharedPtrStateBase =
             (_func_int **)this;
        ((SharedPtrStateBase *)local_98._8_8_)->strongRefCount = 1;
        ((SharedPtrStateBase *)local_98._8_8_)->weakRefCount = 1;
        std::vector<de::SharedPtr<LogFileReader>,std::allocator<de::SharedPtr<LogFileReader>>>::
        emplace_back<de::SharedPtr<LogFileReader>>
                  ((vector<de::SharedPtr<LogFileReader>,std::allocator<de::SharedPtr<LogFileReader>>>
                    *)&local_178,(SharedPtr<LogFileReader> *)local_98);
        if ((SharedPtrStateBase *)local_98._8_8_ != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = (deInt32 *)(local_98._8_8_ + 8);
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_98._0_8_ = (LogFileReader *)0x0;
            (*(*(_func_int ***)local_98._8_8_)[2])();
          }
          LOCK();
          pdVar1 = (deInt32 *)(local_98._8_8_ + 0xc);
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if ((*pdVar1 == 0) && ((SharedPtrStateBase *)local_98._8_8_ != (SharedPtrStateBase *)0x0))
          {
            (*(*(_func_int ***)local_98._8_8_)[1])();
          }
        }
        de::Thread::start(&(local_178.
                            super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->super_Thread);
        lVar23 = lVar23 + 1;
        iVar18 = (int)((ulong)((long)local_128.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar19 = lVar19 + 0x20;
        lVar21 = lVar21 + 0x48;
      } while (lVar23 < iVar18);
      if (0 < iVar18) {
        lVar21 = 0;
        lVar19 = 0;
        do {
          de::Thread::join(*(Thread **)
                            ((long)&(local_178.
                                     super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar21));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_108,
                     *(char **)((long)&((local_128.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar21 * 2),&local_179);
          de::FilePath::getBaseName_abi_cxx11_((string *)local_98,(FilePath *)local_108);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                     (string *)local_98);
          if ((LogFileReader *)local_98._0_8_ != (LogFileReader *)local_88) {
            operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
          }
          if (local_108 != (undefined1  [8])&local_f8) {
            operator_delete((void *)local_108,(ulong)(local_f8._M_dataplus._M_p + 1));
          }
          lVar19 = lVar19 + 1;
          lVar21 = lVar21 + 0x10;
        } while (lVar19 < (int)((ulong)((long)local_128.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_128.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 5));
      }
    }
    std::vector<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>::
    ~vector(&local_178);
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_108 = (undefined1  [8])0x0;
    pbStack_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    p_Var2 = (_Base_ptr)(local_98 + 8);
    local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
    local_88._0_8_ = (char *)0x0;
    local_70 = (ShortBatchResult *)0x0;
    local_88._8_8_ = p_Var2;
    local_78 = p_Var2;
    if (local_158.m_options.
        super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_158.m_options.
        super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pOVar12 = local_158.m_options.
                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pOVar22 = local_158.m_options.
                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        __k = (key_type *)pOVar22->shortName;
        if (__k != (key_type *)pOVar22->longName) {
          do {
            iVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_98,__k);
            if (iVar11._M_node == p_Var2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_108,__k);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_98,__k);
            }
            __k = (key_type *)&__k[2]._M_string_length;
            pOVar12 = local_158.m_options.
                      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          } while (__k != (key_type *)pOVar22->longName);
        }
        pOVar22 = (pointer)&pOVar22->dispatchParse;
      } while (pOVar22 != pOVar12);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_98);
    pbVar8 = pbStack_100;
    auVar17 = local_108;
    if (local_138._4_4_ == 1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TestCasePath",0xc);
      pbVar26 = local_b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(pbVar26->_M_dataplus)._M_p,pbVar26->_M_string_length);
          pbVar26 = pbVar26 + 1;
        } while (pbVar26 !=
                 local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    }
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar17;
    local_38 = pbVar8;
    if (local_108 == (undefined1  [8])pbStack_100) {
      local_140 = 0;
    }
    else {
      local_140 = 0;
      auVar17 = local_108;
      do {
        local_178.
        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.
        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.
        super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar24 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar17)->
                  _M_dataplus)._M_p;
        local_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auVar17;
        std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::resize
                  ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                   &local_178,
                   ((long)local_158.m_options.
                          super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_158.m_options.
                          super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
        pSVar20 = local_178.
                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)((ulong)((long)local_158.m_options.
                                    super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_158.m_options.
                                   super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39) {
          lVar19 = 0;
          lVar21 = 0;
          do {
            pOVar12 = local_158.m_options.
                      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_98,pcVar24,&local_179);
            cVar13 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)((long)&pOVar12->defaultValue + lVar19),(key_type *)local_98);
            if ((LogFileReader *)local_98._0_8_ != (LogFileReader *)local_88) {
              operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
            }
            pSVar20 = local_178.
                      super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((_Base_ptr)(&pOVar12->isFlag + lVar19) == cVar13._M_node) {
              pcVar5 = *(char **)((long)&(local_178.
                                          super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                 lVar19);
              ppLVar6 = &(local_178.
                          super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
              strlen(pcVar24);
              std::__cxx11::string::_M_replace((long)ppLVar6 + lVar19,0,pcVar5,(ulong)pcVar24);
              *(undefined8 *)
               ((long)&local_178.
                       super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2].m_ptr + lVar19) = 0xe00000000;
            }
            else {
              _Var3 = cVar13._M_node[2]._M_color;
              lVar23 = *(long *)((long)&pOVar12->shortName + lVar19);
              std::__cxx11::string::_M_assign
                        ((string *)
                         ((long)&(local_178.
                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar19));
              *(undefined8 *)((long)&pSVar20[2].m_ptr + lVar19) =
                   *(undefined8 *)((long)(int)_Var3 * 0x48 + lVar23 + 0x20);
              std::__cxx11::string::_M_assign((string *)((long)&pSVar20[2].m_state + lVar19));
            }
            lVar21 = lVar21 + 1;
            lVar19 = lVar19 + 0x48;
            pSVar20 = local_178.
                      super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (lVar21 < (int)((ulong)((long)local_158.m_options.
                                                super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_158.m_options.
                                               super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            0x38e38e39);
        }
        do {
          if ((pointer)&pSVar20[4].m_state ==
              local_178.
              super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_140 = (ulong)((int)local_140 + 1);
            if ((int)local_138 != 0) goto LAB_001122c3;
            break;
          }
          pSVar7 = pSVar20 + 6;
          pSVar20 = (pointer)&pSVar20[4].m_state;
        } while (*(int *)((long)&pSVar7->m_state + 4) ==
                 *(int *)((long)&local_178.
                                 super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[2].m_ptr + 4));
        if (local_138._4_4_ == 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(local_110->_M_dataplus)._M_p,local_110->_M_string_length
                    );
          for (pSVar20 = local_178.
                         super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pSVar20 !=
              local_178.
              super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
              ._M_impl.super__Vector_impl_data._M_finish; pSVar20 = (pointer)&pSVar20[4].m_state) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
            if (local_130 == 0) {
              TVar4 = *(TestStatusCode *)((long)&pSVar20[2].m_ptr + 4);
              pcVar24 = "Missing";
              if (TVar4 != TESTSTATUSCODE_LAST) {
                pcVar24 = xe::getTestStatusCodeName(TVar4);
                goto LAB_00112263;
              }
LAB_00112268:
              sVar15 = strlen(pcVar24);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar24,sVar15);
            }
            else {
              pcVar24 = (char *)pSVar20[2].m_state;
LAB_00112263:
              if ((SharedPtrStateBase *)pcVar24 != (SharedPtrStateBase *)0x0) goto LAB_00112268;
              std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x130220);
            }
          }
LAB_001122ab:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        else if (local_138._4_4_ == 0) {
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(local_110->_M_dataplus)._M_p,
                               local_110->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          if (0 < (int)((ulong)((long)local_178.
                                      super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_178.
                                     super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39)
          {
            lVar23 = 8;
            lVar21 = 0;
            lVar19 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   *(char **)((long)local_b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             lVar23 + -8),
                                   *(long *)((long)&((local_b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar23));
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
              TVar4 = *(TestStatusCode *)
                       ((long)&local_178.
                               super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].m_ptr + lVar21 + 4);
              pcVar24 = "Missing";
              if ((TVar4 == TESTSTATUSCODE_LAST) ||
                 (pcVar24 = xe::getTestStatusCodeName(TVar4), pcVar24 != (char *)0x0)) {
                sVar15 = strlen(pcVar24);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar24,sVar15);
              }
              else {
                std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,*(char **)((long)&local_178.
                                                                                                                          
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  m_state + lVar21),
                                   *(long *)((long)&local_178.
                                                                                                        
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].m_ptr
                                            + lVar21));
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,")\n",2);
              lVar19 = lVar19 + 1;
              lVar21 = lVar21 + 0x48;
              lVar23 = lVar23 + 0x20;
            } while (lVar19 < (int)((ulong)((long)local_178.
                                                  super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_178.
                                                 super__Vector_base<de::SharedPtr<LogFileReader>,_std::allocator<de::SharedPtr<LogFileReader>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                              0x38e38e39);
          }
          goto LAB_001122ab;
        }
LAB_001122c3:
        std::vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_>::~vector
                  ((vector<xe::TestCaseResultHeader,_std::allocator<xe::TestCaseResultHeader>_> *)
                   &local_178);
        auVar17 = (undefined1  [8])(local_110 + 1);
      } while (auVar17 != (undefined1  [8])pbStack_100);
    }
    iVar18 = (int)((ulong)((long)local_38 - (long)local_40) >> 5);
    iVar25 = (int)local_140;
    if (local_138._4_4_ == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," / ",3);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,iVar18);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," test case results match.\n",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Comparison ",0xd);
      pcVar24 = "passed";
      if (iVar25 != iVar18) {
        pcVar24 = "FAILED";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar24,6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"!\n",2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108);
    iVar18 = -(uint)(iVar25 != iVar18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    std::vector<ShortBatchResult,_std::allocator<ShortBatchResult>_>::~vector
              ((vector<ShortBatchResult,_std::allocator<ShortBatchResult>_> *)&local_158);
  }
  else {
    pcVar24 = *argv;
    if (pcVar24 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x130220);
    }
    else {
      sVar15 = strlen(pcVar24);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar24,sVar15);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": [options] [filenames]\n",0x18);
    de::cmdline::detail::Parser::help(&local_158,(ostream *)&std::cout);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    de::cmdline::detail::TypedFieldMap::~TypedFieldMap((TypedFieldMap *)local_108);
    de::cmdline::detail::Parser::~Parser(&local_158);
    iVar18 = -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return iVar18;
}

Assistant:

int main (int argc, const char* const* argv)
{
	CommandLine cmdLine;

	if (!parseCommandLine(cmdLine, argc, argv))
		return -1;

	try
	{
		bool compareOk = runCompare(cmdLine, std::cout);
		return compareOk ? 0 : -1;
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}
}